

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O3

Aig_Man_t * Fra_FraigPerform(Aig_Man_t *pManAig,Fra_Par_t *pPars)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  Fra_Man_t *p;
  Fra_Sml_t *pFVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  timespec ts;
  timespec local_30;
  
  if (pManAig->nObjs[6] + pManAig->nObjs[5] == 0) {
    pAVar2 = Aig_ManDupOrdered(pManAig);
    return pAVar2;
  }
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  p = Fra_ManStart(pManAig,pPars);
  pAVar2 = Fra_ManPrepareComb(p);
  p->pManFraig = pAVar2;
  pFVar3 = Fra_SmlStart(pManAig,0,1,pPars->nSimWords);
  p->pSml = pFVar3;
  Fra_SmlSimulate(p,0);
  iVar1 = Fra_ClassesCountLits(p->pCla);
  p->nLitsBeg = iVar1;
  p->nNodesBeg = pManAig->nObjs[6] + pManAig->nObjs[5];
  p->nRegsBeg = pManAig->nRegs;
  if (p->pPars->fVerbose != 0) {
    Fra_ClassesPrint(p->pCla,1);
  }
  Fra_FraigSweep(p);
  if (pManAig->pImpFunc != (_func_void_void_ptr_void_ptr *)0x0) {
    (*pManAig->pImpFunc)(p,pManAig->pImpData);
  }
  Fra_ManFinalizeComb(p);
  if (p->pPars->fChoicing == 0) {
    Fra_ClassesCopyReprs(p->pCla,p->vTimeouts);
    Aig_ManCleanup(p->pManFraig);
    pAVar2 = p->pManFraig;
    p->pManFraig = (Aig_Man_t *)0x0;
  }
  else {
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar5 = 1;
    }
    else {
      lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
      lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_30.tv_sec * -1000000;
    }
    Fra_ClassesCopyReprs(p->pCla,p->vTimeouts);
    pAVar2 = Aig_ManDupRepr(p->pManAig,1);
    Aig_ManReprStart(pAVar2,pAVar2->vObjs->nSize);
    Aig_ManTransferRepr(pAVar2,p->pManAig);
    Aig_ManMarkValidChoices(pAVar2);
    Aig_ManStop(p->pManFraig);
    p->pManFraig = (Aig_Man_t *)0x0;
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    p->timeTrav = p->timeTrav + lVar6 + lVar5;
  }
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  p->timeTotal = lVar5 + lVar4;
  iVar1 = Fra_ClassesCountLits(p->pCla);
  p->nLitsEnd = iVar1;
  p->nNodesEnd = pAVar2->nObjs[6] + pAVar2->nObjs[5];
  p->nRegsEnd = pAVar2->nRegs;
  Fra_ManStop(p);
  return pAVar2;
}

Assistant:

Aig_Man_t * Fra_FraigPerform( Aig_Man_t * pManAig, Fra_Par_t * pPars )
{
    Fra_Man_t * p;
    Aig_Man_t * pManAigNew;
    abctime clk;
    if ( Aig_ManNodeNum(pManAig) == 0 )
        return Aig_ManDupOrdered(pManAig);
clk = Abc_Clock();
    p = Fra_ManStart( pManAig, pPars );
    p->pManFraig = Fra_ManPrepareComb( p );
    p->pSml = Fra_SmlStart( pManAig, 0, 1, pPars->nSimWords );
    Fra_SmlSimulate( p, 0 );
//    if ( p->pPars->fChoicing )
//        Aig_ManReprStart( p->pManFraig, Aig_ManObjNumMax(p->pManAig) );
    // collect initial states
    p->nLitsBeg  = Fra_ClassesCountLits( p->pCla );
    p->nNodesBeg = Aig_ManNodeNum(pManAig);
    p->nRegsBeg  = Aig_ManRegNum(pManAig);
    // perform fraig sweep
if ( p->pPars->fVerbose )
Fra_ClassesPrint( p->pCla, 1 );
    Fra_FraigSweep( p );
    // call back the procedure to check implications
    if ( pManAig->pImpFunc )
        pManAig->pImpFunc( p, pManAig->pImpData );
    // no need to filter one-hot clauses because they satisfy base case by construction
    // finalize the fraiged manager
    Fra_ManFinalizeComb( p );
    if ( p->pPars->fChoicing )
    { 
abctime clk2 = Abc_Clock();
        Fra_ClassesCopyReprs( p->pCla, p->vTimeouts );
        pManAigNew = Aig_ManDupRepr( p->pManAig, 1 );
        Aig_ManReprStart( pManAigNew, Aig_ManObjNumMax(pManAigNew) );
        Aig_ManTransferRepr( pManAigNew, p->pManAig );
        Aig_ManMarkValidChoices( pManAigNew );
        Aig_ManStop( p->pManFraig );
        p->pManFraig = NULL;
p->timeTrav += Abc_Clock() - clk2;
    }
    else
    {
        Fra_ClassesCopyReprs( p->pCla, p->vTimeouts );
        Aig_ManCleanup( p->pManFraig );
        pManAigNew = p->pManFraig;
        p->pManFraig = NULL;
    }
p->timeTotal = Abc_Clock() - clk;
    // collect final stats
    p->nLitsEnd  = Fra_ClassesCountLits( p->pCla );
    p->nNodesEnd = Aig_ManNodeNum(pManAigNew);
    p->nRegsEnd  = Aig_ManRegNum(pManAigNew);
    Fra_ManStop( p );
    return pManAigNew;
}